

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O2

adiak_datatype_t *
parse_typestr_helper
          (char *typestr,int typestr_start,int typestr_end,int is_reference,va_list *ap,
          int *new_typestr_start)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ushort **ppuVar4;
  void *pvVar5;
  adiak_datatype_t *paVar6;
  int *piVar7;
  adiak_datatype_t **ppaVar8;
  adiak_datatype_t *paVar9;
  int iVar10;
  char *pcVar11;
  adiak_datatype_t *paVar12;
  int iVar13;
  char cVar14;
  va_list *pa_Var15;
  long lVar16;
  bool bVar17;
  int local_54;
  ulong local_50;
  va_list *local_48;
  int *local_40;
  long local_38;
  
  if (typestr_start == typestr_end || typestr == (char *)0x0) {
    return (adiak_datatype_t *)0x0;
  }
  local_48 = ap;
  local_40 = new_typestr_start;
  ppuVar4 = __ctype_b_loc();
  pcVar11 = typestr + typestr_start;
  do {
    do {
      cVar14 = *pcVar11;
      typestr_start = typestr_start + 1;
      pcVar11 = pcVar11 + 1;
    } while ((long)cVar14 == 0x2c);
  } while (((*ppuVar4)[cVar14] & 0x2000) != 0);
  bVar17 = cVar14 == '&';
  local_50 = (ulong)bVar17;
  if (bVar17) {
    is_reference = 1;
  }
  iVar13 = (uint)bVar17 + typestr_start + -1;
  local_38 = (long)iVar13;
  cVar14 = typestr[local_38];
  pvVar5 = memchr("[{<(",(int)cVar14,5);
  if (pvVar5 == (void *)0x0) {
    paVar6 = (adiak_datatype_t *)0x0;
  }
  else {
    paVar6 = (adiak_datatype_t *)calloc(1,0x20);
  }
  if (cVar14 != '%') {
    if (cVar14 != '(') {
      if (cVar14 == '<') {
        iVar13 = find_end_brace(typestr,'>',iVar13,typestr_end);
        if (iVar13 != -1) {
          paVar6->dtype = adiak_range;
          paVar6->numerical = adiak_categorical;
          paVar6->is_reference = is_reference;
          paVar6->num_elements = (uint)(is_reference == 0) * 2;
          paVar6->num_ref_elements = (uint)(is_reference != 0) * 2;
          paVar6->num_subtypes = 1;
          ppaVar8 = (adiak_datatype_t **)malloc(8);
          paVar6->subtype = ppaVar8;
          iVar3 = (int)local_50;
          pa_Var15 = local_48;
          goto LAB_00103481;
        }
      }
      else {
        if ((cVar14 != '{') && (cVar14 != '[')) {
          return paVar6;
        }
        iVar13 = find_end_brace(typestr,(cVar14 == '{') << 5 | 0x5d,iVar13,typestr_end);
        pa_Var15 = local_48;
        if (iVar13 != -1) {
          uVar1 = (*local_48)[0].gp_offset;
          if ((ulong)uVar1 < 0x29) {
            piVar7 = (int *)((ulong)uVar1 + (long)(*local_48)[0].reg_save_area);
            (*local_48)[0].gp_offset = uVar1 + 8;
          }
          else {
            piVar7 = (int *)(*local_48)[0].overflow_arg_area;
            (*local_48)[0].overflow_arg_area = piVar7 + 2;
          }
          iVar3 = *piVar7;
          iVar10 = 0;
          if (is_reference == 0) {
            iVar10 = iVar3;
          }
          paVar6->num_elements = iVar10;
          if (is_reference == 0) {
            iVar3 = 0;
          }
          paVar6->num_ref_elements = iVar3;
          paVar6->dtype = (typestr[local_38] == '{') + adiak_set;
          paVar6->numerical = adiak_categorical;
          paVar6->is_reference = is_reference;
          paVar6->num_subtypes = 1;
          ppaVar8 = (adiak_datatype_t **)malloc(8);
          paVar6->subtype = ppaVar8;
          iVar3 = (int)local_50;
LAB_00103481:
          paVar9 = parse_typestr_helper
                             (typestr,iVar3 + typestr_start,iVar13,is_reference,pa_Var15,&local_54);
          *paVar6->subtype = paVar9;
          if (*paVar6->subtype != (adiak_datatype_t *)0x0) {
            *local_40 = iVar13 + 1;
            return paVar6;
          }
          goto LAB_00103593;
        }
      }
      goto switchD_00103572_caseD_65;
    }
    iVar13 = find_end_brace(typestr,')',iVar13,typestr_end);
    if (iVar13 == -1) goto switchD_00103572_caseD_65;
    paVar6->dtype = adiak_tuple;
    paVar6->numerical = adiak_categorical;
    paVar6->is_reference = is_reference;
    uVar1 = (*local_48)[0].gp_offset;
    if ((ulong)uVar1 < 0x29) {
      piVar7 = (int *)((ulong)uVar1 + (long)(*local_48)[0].reg_save_area);
      (*local_48)[0].gp_offset = uVar1 + 8;
    }
    else {
      piVar7 = (int *)(*local_48)[0].overflow_arg_area;
      (*local_48)[0].overflow_arg_area = piVar7 + 2;
    }
    iVar3 = *piVar7;
    lVar16 = 0;
    iVar10 = iVar3;
    iVar2 = 0;
    if (is_reference == 0) {
      iVar10 = 0;
      iVar2 = iVar3;
    }
    paVar6->num_elements = iVar2;
    paVar6->num_ref_elements = iVar10;
    paVar6->num_subtypes = iVar3;
    ppaVar8 = (adiak_datatype_t **)calloc(1,(long)iVar3 << 3);
    pa_Var15 = local_48;
    paVar6->subtype = ppaVar8;
    local_54 = (int)local_50 + typestr_start;
    do {
      if (paVar6->num_subtypes <= lVar16) {
        return paVar6;
      }
      paVar9 = parse_typestr_helper(typestr,local_54,iVar13,is_reference,pa_Var15,&local_54);
      paVar6->subtype[lVar16] = paVar9;
      ppaVar8 = paVar6->subtype + lVar16;
      lVar16 = lVar16 + 1;
    } while (*ppaVar8 != (adiak_datatype_t *)0x0);
    goto LAB_00103593;
  }
  iVar13 = (int)local_50;
  iVar3 = iVar13 + typestr_start;
  cVar14 = typestr[iVar3];
  if (cVar14 == 'l') {
    iVar3 = iVar13 + typestr_start + 1;
    cVar14 = typestr[iVar3];
    if (cVar14 == 'l') {
      iVar3 = iVar13 + typestr_start + 2;
      cVar14 = typestr[iVar3];
      paVar12 = &base_ulonglong;
      paVar9 = &base_longlong;
    }
    else {
      paVar12 = &base_ulong;
      paVar9 = &base_long;
    }
  }
  else {
    paVar12 = &base_uint;
    paVar9 = &base_int;
  }
  switch(cVar14) {
  case 'd':
    goto switchD_00103572_caseD_64;
  case 'e':
  case 'g':
  case 'h':
  case 'i':
  case 'j':
  case 'k':
  case 'l':
  case 'm':
  case 'n':
  case 'o':
  case 'q':
    goto switchD_00103572_caseD_65;
  case 'f':
    paVar9 = &base_double;
    goto switchD_00103572_caseD_64;
  case 'p':
    paVar6 = &base_path;
    paVar9 = &base_path_ref;
    break;
  case 'r':
    paVar6 = &base_catstring;
    paVar9 = &base_catstring_ref;
    break;
  case 's':
    paVar6 = &base_string;
    paVar9 = &base_string_ref;
    break;
  case 't':
    paVar9 = &base_timeval;
    goto switchD_00103572_caseD_64;
  case 'u':
    paVar9 = paVar12;
    goto switchD_00103572_caseD_64;
  case 'v':
    paVar6 = &base_version;
    paVar9 = &base_version_ref;
    break;
  default:
    if (cVar14 == 'D') {
      paVar9 = &base_date;
      goto switchD_00103572_caseD_64;
    }
    goto switchD_00103572_caseD_65;
  }
  if (is_reference == 0) {
    paVar9 = paVar6;
  }
switchD_00103572_caseD_64:
  *local_40 = iVar3 + 1;
  return paVar9;
switchD_00103572_caseD_65:
  if (paVar6 != (adiak_datatype_t *)0x0) {
LAB_00103593:
    free_adiak_type(paVar6);
  }
  return (adiak_datatype_t *)0x0;
}

Assistant:

static adiak_datatype_t *parse_typestr_helper(const char *typestr, int typestr_start, int typestr_end, int is_reference,
                                       va_list *ap, int *new_typestr_start)

{
   adiak_datatype_t *t = NULL;
   int cur = typestr_start;
   int end_brace, i;
   int is_long = 0, is_longlong = 0;

   if (!typestr)
      goto error;
   if (typestr_start == typestr_end)
      goto error;

   while (isspace(typestr[cur]) || typestr[cur] == ',')
      cur++;
   if (typestr[cur] == '&') {
      is_reference = 1;
      cur++;
   }

   if (strchr("[{<(", typestr[cur])) {
      t = (adiak_datatype_t *) malloc(sizeof(adiak_datatype_t));
      memset(t, 0, sizeof(*t));
   }
   if (typestr[cur] == '{' || typestr[cur] == '[') {
      end_brace = find_end_brace(typestr, typestr[cur] == '{' ? '}' : ']',
                                 cur, typestr_end);
      if (end_brace == -1)
         goto error;
      int num_elements = va_arg(*ap, int);
      t->num_elements = (is_reference ? 0 : num_elements);
      t->num_ref_elements = (is_reference ? num_elements : 0);
      t->dtype = typestr[cur] == '{' ? adiak_list : adiak_set;
      t->numerical = adiak_categorical;
      t->is_reference = is_reference;
      t->num_subtypes = 1;
      t->subtype = (adiak_datatype_t **) malloc(sizeof(adiak_datatype_t *));
      t->subtype[0] = parse_typestr_helper(typestr, cur+1, end_brace, is_reference, ap, &cur);
      if (t->subtype[0] == NULL)
         goto error;
      *new_typestr_start = end_brace+1;
      goto done;
   }
   else if (typestr[cur] == '<') {
      end_brace = find_end_brace(typestr, '>', cur, typestr_end);
      if (end_brace == -1)
         goto error;
      t->dtype = adiak_range;
      t->numerical = adiak_categorical;
      t->is_reference = is_reference;
      t->num_elements = (is_reference ? 0 : 2);
      t->num_ref_elements = (is_reference ? 2 : 0);
      t->num_subtypes = 1;
      t->subtype = (adiak_datatype_t **) malloc(sizeof(adiak_datatype_t *));
      t->subtype[0] = parse_typestr_helper(typestr, cur+1, end_brace, is_reference, ap, &cur);
      if (t->subtype[0] == NULL)
         goto error;
      *new_typestr_start = end_brace+1;
      goto done;
   }
   else if (typestr[cur] == '(') {
      end_brace = find_end_brace(typestr, ')', cur, typestr_end);
      if (end_brace == -1)
         goto error;
      t->dtype = adiak_tuple;
      t->numerical = adiak_categorical;
      t->is_reference = is_reference;
      int num_elements = va_arg(*ap, int);
      t->num_elements = (is_reference ? 0 : num_elements);
      t->num_ref_elements = (is_reference ? num_elements : 0);
      t->num_subtypes = num_elements;
      t->subtype = (adiak_datatype_t **) malloc(sizeof(adiak_datatype_t *) * t->num_subtypes);
      memset(t->subtype, 0, sizeof(adiak_datatype_t *) * t->num_subtypes);
      cur++;
      for (i = 0; i < t->num_subtypes; i++) {
         t->subtype[i] = parse_typestr_helper(typestr, cur, end_brace, is_reference, ap, &cur);
         if (!t->subtype[i])
            goto error;
      }
   }
   else if (typestr[cur] == '%') {
      cur++;
      if (typestr[cur] == 'l') {
         is_long = 1;
         cur++;
         if (typestr[cur] == 'l') {
            is_longlong = 1;
            cur++;
         }
      }
      switch (typestr[cur]) {
         case 'd':
            t = is_long ? (is_longlong ? &base_longlong  : &base_long)  : &base_int;
            break;
         case 'u':
            t = is_long ? (is_longlong ? &base_ulonglong : &base_ulong) : &base_uint;
            break;
         case 'f':
            t = &base_double;
            break;
         case 'D':
            t = &base_date;
            break;
         case 't':
            t = &base_timeval;
            break;
         case 'v':
            t = (is_reference ? &base_version_ref : &base_version);
            break;
         case 's':
            t = (is_reference ? &base_string_ref : &base_string);
            break;
         case 'r':
            t = (is_reference ? &base_catstring_ref : &base_catstring);
            break;
         case 'p':
            t = (is_reference ? &base_path_ref : &base_path);
            break;
         default:
            goto error;
      }
      cur++;
      *new_typestr_start = cur;
      goto done;
   }

  done:
   return t;
  error:
   if (t)
      free_adiak_type(t);
   return NULL;
}